

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgAcceleratedDataStructures.hpp
# Opt level: O0

GpuVector<double> * __thiscall
TasGrid::GpuVector<double>::operator=(GpuVector<double> *this,GpuVector<double> *other)

{
  undefined1 local_28 [8];
  GpuVector<double> temp;
  GpuVector<double> *other_local;
  GpuVector<double> *this_local;
  
  temp.gpu_data = (double *)other;
  GpuVector((GpuVector<double> *)local_28,other);
  ::std::swap<unsigned_long>(&this->num_entries,(unsigned_long *)local_28);
  ::std::swap<double*>(&this->gpu_data,(double **)&temp);
  ~GpuVector((GpuVector<double> *)local_28);
  return this;
}

Assistant:

GpuVector<T>& operator =(GpuVector<T> &&other){
        GpuVector<T> temp(std::move(other));
        std::swap(num_entries, temp.num_entries);
        std::swap(gpu_data, temp.gpu_data);
        #ifdef Tasmanian_ENABLE_DPCPP
        std::swap(sycl_queue, temp.sycl_queue);
        #endif
        return *this;
    }